

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

bool embree::avx::SphereMiMBIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  uint uVar1;
  Scene *pSVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  undefined4 uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  float fVar52;
  float fVar53;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar49 [32];
  float fVar54;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar58;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar72;
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  float fVar93;
  float fVar94;
  undefined1 auVar95 [64];
  float fVar96;
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<8> hit;
  undefined8 local_330;
  undefined8 uStack_328;
  size_t local_320;
  undefined4 local_314;
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar86 [64];
  
  pSVar2 = context->scene;
  uVar1 = sphere->sharedGeomID;
  pGVar3 = (pSVar2->geometries).items[uVar1].ptr;
  fVar93 = (pGVar3->time_range).lower;
  fVar93 = pGVar3->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar93) / ((pGVar3->time_range).upper - fVar93));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),9);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx(ZEXT816(0) << 0x20,auVar39);
  uVar23 = (ulong)(sphere->primIDs).field_0.i[0];
  lVar24 = *(long *)&pGVar3[2].numPrimitives;
  lVar30 = (long)(int)auVar39._0_4_ * 0x38;
  lVar4 = *(long *)(lVar24 + lVar30);
  lVar33 = *(long *)(lVar24 + 0x10 + lVar30);
  uVar27 = (ulong)(sphere->primIDs).field_0.i[1];
  uVar28 = (ulong)(sphere->primIDs).field_0.i[2];
  uVar25 = (ulong)(sphere->primIDs).field_0.i[3];
  uVar26 = (ulong)(sphere->primIDs).field_0.i[4];
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar26);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar23);
  uVar32 = (ulong)(sphere->primIDs).field_0.i[5];
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar32);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar27);
  uVar34 = (ulong)(sphere->primIDs).field_0.i[6];
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar34);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar28);
  uVar29 = (ulong)(sphere->primIDs).field_0.i[7];
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar29);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar33 * uVar25);
  lVar4 = *(long *)(lVar24 + 0x38 + lVar30);
  lVar24 = *(long *)(lVar24 + 0x48 + lVar30);
  auVar83._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar26 * lVar24);
  auVar83._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar23 * lVar24);
  lVar33 = uVar32 * lVar24;
  auVar87._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar33);
  auVar87._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar27 * lVar24);
  auVar89._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar34 * lVar24);
  auVar89._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar28 * lVar24);
  auVar91._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar24 * uVar29);
  auVar91._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar25 * lVar24);
  fVar93 = fVar93 - auVar39._0_4_;
  auVar60 = vunpcklps_avx(auVar59,auVar77);
  auVar6 = vunpckhps_avx(auVar59,auVar77);
  auVar61 = vunpcklps_avx(auVar73,auVar79);
  auVar59 = vunpckhps_avx(auVar73,auVar79);
  auVar7 = vunpcklps_avx(auVar60,auVar61);
  auVar60 = vunpckhps_avx(auVar60,auVar61);
  auVar8 = vunpcklps_avx(auVar6,auVar59);
  auVar6 = vunpckhps_avx(auVar6,auVar59);
  auVar9 = vunpcklps_avx(auVar83,auVar89);
  auVar59 = vunpckhps_avx(auVar83,auVar89);
  auVar73 = vunpcklps_avx(auVar87,auVar91);
  auVar61 = vunpckhps_avx(auVar87,auVar91);
  auVar10 = vunpcklps_avx(auVar9,auVar73);
  auVar9 = vunpckhps_avx(auVar9,auVar73);
  auVar11 = vunpcklps_avx(auVar59,auVar61);
  auVar73 = vunpckhps_avx(auVar59,auVar61);
  auVar39 = vshufps_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),0);
  auVar48 = vshufps_avx(ZEXT416((uint)(1.0 - fVar93)),ZEXT416((uint)(1.0 - fVar93)),0);
  auVar49._8_4_ = 0x3f800000;
  auVar49._0_8_ = &DAT_3f8000003f800000;
  auVar49._12_4_ = 0x3f800000;
  auVar49._16_4_ = 0x3f800000;
  auVar49._20_4_ = 0x3f800000;
  auVar49._24_4_ = 0x3f800000;
  auVar49._28_4_ = 0x3f800000;
  fVar93 = auVar39._0_4_;
  fVar96 = auVar39._4_4_;
  fVar58 = auVar39._8_4_;
  fVar94 = auVar39._12_4_;
  fVar37 = auVar48._0_4_;
  fVar45 = auVar48._4_4_;
  fVar46 = auVar48._8_4_;
  fVar42 = auVar48._12_4_;
  auVar80._0_4_ = auVar10._0_4_ * fVar93 + fVar37 * auVar7._0_4_;
  auVar80._4_4_ = auVar10._4_4_ * fVar96 + fVar45 * auVar7._4_4_;
  auVar80._8_4_ = auVar10._8_4_ * fVar58 + fVar46 * auVar7._8_4_;
  auVar80._12_4_ = auVar10._12_4_ * fVar94 + fVar42 * auVar7._12_4_;
  auVar80._16_4_ = auVar10._16_4_ * fVar93 + fVar37 * auVar7._16_4_;
  auVar80._20_4_ = auVar10._20_4_ * fVar96 + fVar45 * auVar7._20_4_;
  auVar80._24_4_ = auVar10._24_4_ * fVar58 + fVar46 * auVar7._24_4_;
  auVar80._28_4_ = auVar10._28_4_ + auVar7._28_4_;
  auVar78._0_4_ = fVar37 * auVar60._0_4_ + fVar93 * auVar9._0_4_;
  auVar78._4_4_ = fVar45 * auVar60._4_4_ + fVar96 * auVar9._4_4_;
  auVar78._8_4_ = fVar46 * auVar60._8_4_ + fVar58 * auVar9._8_4_;
  auVar78._12_4_ = fVar42 * auVar60._12_4_ + fVar94 * auVar9._12_4_;
  auVar78._16_4_ = fVar37 * auVar60._16_4_ + fVar93 * auVar9._16_4_;
  auVar78._20_4_ = fVar45 * auVar60._20_4_ + fVar96 * auVar9._20_4_;
  auVar78._24_4_ = fVar46 * auVar60._24_4_ + fVar58 * auVar9._24_4_;
  auVar78._28_4_ = auVar60._28_4_ + auVar9._28_4_;
  auVar84._0_4_ = auVar11._0_4_ * fVar93 + auVar8._0_4_ * fVar37;
  auVar84._4_4_ = auVar11._4_4_ * fVar96 + auVar8._4_4_ * fVar45;
  auVar84._8_4_ = auVar11._8_4_ * fVar58 + auVar8._8_4_ * fVar46;
  auVar84._12_4_ = auVar11._12_4_ * fVar94 + auVar8._12_4_ * fVar42;
  auVar84._16_4_ = auVar11._16_4_ * fVar93 + auVar8._16_4_ * fVar37;
  auVar84._20_4_ = auVar11._20_4_ * fVar96 + auVar8._20_4_ * fVar45;
  auVar84._24_4_ = auVar11._24_4_ * fVar58 + auVar8._24_4_ * fVar46;
  auVar84._28_4_ = auVar11._28_4_ + auVar9._28_4_;
  fVar38 = fVar37 * auVar6._0_4_ + fVar93 * auVar73._0_4_;
  fVar40 = fVar45 * auVar6._4_4_ + fVar96 * auVar73._4_4_;
  fVar41 = fVar46 * auVar6._8_4_ + fVar58 * auVar73._8_4_;
  fVar43 = fVar42 * auVar6._12_4_ + fVar94 * auVar73._12_4_;
  fVar44 = fVar37 * auVar6._16_4_ + fVar93 * auVar73._16_4_;
  fVar45 = fVar45 * auVar6._20_4_ + fVar96 * auVar73._20_4_;
  fVar46 = fVar46 * auVar6._24_4_ + fVar58 * auVar73._24_4_;
  local_1f0 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
  local_200 = local_1f0;
  uVar31 = *(undefined4 *)(ray + k * 4);
  auVar60._4_4_ = uVar31;
  auVar60._0_4_ = uVar31;
  auVar60._8_4_ = uVar31;
  auVar60._12_4_ = uVar31;
  auVar60._16_4_ = uVar31;
  auVar60._20_4_ = uVar31;
  auVar60._24_4_ = uVar31;
  auVar60._28_4_ = uVar31;
  auVar59 = vsubps_avx(auVar80,auVar60);
  uVar31 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar61._4_4_ = uVar31;
  auVar61._0_4_ = uVar31;
  auVar61._8_4_ = uVar31;
  auVar61._12_4_ = uVar31;
  auVar61._16_4_ = uVar31;
  auVar61._20_4_ = uVar31;
  auVar61._24_4_ = uVar31;
  auVar61._28_4_ = uVar31;
  auVar60 = vsubps_avx(auVar78,auVar61);
  uVar31 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar62._4_4_ = uVar31;
  auVar62._0_4_ = uVar31;
  auVar62._8_4_ = uVar31;
  auVar62._12_4_ = uVar31;
  auVar62._16_4_ = uVar31;
  auVar62._20_4_ = uVar31;
  auVar62._24_4_ = uVar31;
  auVar62._28_4_ = uVar31;
  fVar93 = *(float *)(ray + k * 4 + 0x40);
  auVar92 = ZEXT3264(CONCAT428(fVar93,CONCAT424(fVar93,CONCAT420(fVar93,CONCAT416(fVar93,CONCAT412(
                                                  fVar93,CONCAT48(fVar93,CONCAT44(fVar93,fVar93)))))
                                               )));
  local_220 = *(float *)(ray + k * 4 + 0x50);
  fVar96 = *(float *)(ray + k * 4 + 0x60);
  auVar61 = vsubps_avx(auVar84,auVar62);
  auVar39 = ZEXT416((uint)(fVar93 * fVar93 + local_220 * local_220 + fVar96 * fVar96));
  auVar39 = vshufps_avx(auVar39,auVar39,0);
  auVar63._16_16_ = auVar39;
  auVar63._0_16_ = auVar39;
  auVar6 = vrcpps_avx(auVar63);
  fVar47 = auVar6._0_4_;
  fVar52 = auVar6._4_4_;
  auVar9._4_4_ = fVar52 * auVar39._4_4_;
  auVar9._0_4_ = fVar47 * auVar39._0_4_;
  fVar53 = auVar6._8_4_;
  auVar9._8_4_ = fVar53 * auVar39._8_4_;
  fVar58 = auVar39._12_4_;
  fVar54 = auVar6._12_4_;
  auVar9._12_4_ = fVar54 * fVar58;
  fVar55 = auVar6._16_4_;
  auVar9._16_4_ = fVar55 * auVar39._0_4_;
  fVar56 = auVar6._20_4_;
  auVar9._20_4_ = fVar56 * auVar39._4_4_;
  fVar57 = auVar6._24_4_;
  auVar9._24_4_ = fVar57 * auVar39._8_4_;
  auVar9._28_4_ = fVar58;
  auVar9 = vsubps_avx(auVar49,auVar9);
  fVar47 = fVar47 + fVar47 * auVar9._0_4_;
  fVar52 = fVar52 + fVar52 * auVar9._4_4_;
  fVar53 = fVar53 + fVar53 * auVar9._8_4_;
  fVar54 = fVar54 + fVar54 * auVar9._12_4_;
  fVar55 = fVar55 + fVar55 * auVar9._16_4_;
  fVar56 = fVar56 + fVar56 * auVar9._20_4_;
  fVar57 = fVar57 + fVar57 * auVar9._24_4_;
  fVar37 = auVar6._28_4_;
  fVar72 = fVar37 + fVar37 + fVar58;
  fVar58 = (fVar93 * auVar59._0_4_ + local_220 * auVar60._0_4_ + fVar96 * auVar61._0_4_) * fVar47;
  fVar66 = (fVar93 * auVar59._4_4_ + local_220 * auVar60._4_4_ + fVar96 * auVar61._4_4_) * fVar52;
  auVar8._4_4_ = fVar66;
  auVar8._0_4_ = fVar58;
  fVar67 = (fVar93 * auVar59._8_4_ + local_220 * auVar60._8_4_ + fVar96 * auVar61._8_4_) * fVar53;
  auVar8._8_4_ = fVar67;
  fVar68 = (fVar93 * auVar59._12_4_ + local_220 * auVar60._12_4_ + fVar96 * auVar61._12_4_) * fVar54
  ;
  auVar8._12_4_ = fVar68;
  fVar69 = (fVar93 * auVar59._16_4_ + local_220 * auVar60._16_4_ + fVar96 * auVar61._16_4_) * fVar55
  ;
  auVar8._16_4_ = fVar69;
  fVar70 = (fVar93 * auVar59._20_4_ + local_220 * auVar60._20_4_ + fVar96 * auVar61._20_4_) * fVar56
  ;
  auVar8._20_4_ = fVar70;
  fVar71 = (fVar93 * auVar59._24_4_ + local_220 * auVar60._24_4_ + fVar96 * auVar61._24_4_) * fVar57
  ;
  auVar8._24_4_ = fVar71;
  auVar8._28_4_ = fVar72;
  auVar6._4_4_ = fVar93 * fVar66;
  auVar6._0_4_ = fVar93 * fVar58;
  auVar6._8_4_ = fVar93 * fVar67;
  auVar6._12_4_ = fVar93 * fVar68;
  auVar6._16_4_ = fVar93 * fVar69;
  auVar6._20_4_ = fVar93 * fVar70;
  auVar6._24_4_ = fVar93 * fVar71;
  auVar6._28_4_ = fVar37;
  auVar7._4_4_ = local_220 * fVar66;
  auVar7._0_4_ = local_220 * fVar58;
  auVar7._8_4_ = local_220 * fVar67;
  auVar7._12_4_ = local_220 * fVar68;
  auVar7._16_4_ = local_220 * fVar69;
  auVar7._20_4_ = local_220 * fVar70;
  auVar7._24_4_ = local_220 * fVar71;
  auVar7._28_4_ = fVar94;
  auVar11._4_4_ = fVar96 * fVar66;
  auVar11._0_4_ = fVar96 * fVar58;
  auVar11._8_4_ = fVar96 * fVar67;
  auVar11._12_4_ = fVar96 * fVar68;
  auVar11._16_4_ = fVar96 * fVar69;
  auVar11._20_4_ = fVar96 * fVar70;
  auVar11._24_4_ = fVar96 * fVar71;
  auVar11._28_4_ = auVar10._28_4_;
  auVar9 = vsubps_avx(auVar59,auVar6);
  auVar97 = ZEXT3264(auVar9);
  auVar7 = vsubps_avx(auVar60,auVar7);
  auVar88 = ZEXT3264(auVar7);
  auVar61 = vsubps_avx(auVar61,auVar11);
  auVar90 = ZEXT3264(auVar61);
  auVar74._0_4_ =
       auVar9._0_4_ * auVar9._0_4_ + auVar7._0_4_ * auVar7._0_4_ + auVar61._0_4_ * auVar61._0_4_;
  auVar74._4_4_ =
       auVar9._4_4_ * auVar9._4_4_ + auVar7._4_4_ * auVar7._4_4_ + auVar61._4_4_ * auVar61._4_4_;
  auVar74._8_4_ =
       auVar9._8_4_ * auVar9._8_4_ + auVar7._8_4_ * auVar7._8_4_ + auVar61._8_4_ * auVar61._8_4_;
  auVar74._12_4_ =
       auVar9._12_4_ * auVar9._12_4_ +
       auVar7._12_4_ * auVar7._12_4_ + auVar61._12_4_ * auVar61._12_4_;
  auVar74._16_4_ =
       auVar9._16_4_ * auVar9._16_4_ +
       auVar7._16_4_ * auVar7._16_4_ + auVar61._16_4_ * auVar61._16_4_;
  auVar74._20_4_ =
       auVar9._20_4_ * auVar9._20_4_ +
       auVar7._20_4_ * auVar7._20_4_ + auVar61._20_4_ * auVar61._20_4_;
  auVar74._24_4_ =
       auVar9._24_4_ * auVar9._24_4_ +
       auVar7._24_4_ * auVar7._24_4_ + auVar61._24_4_ * auVar61._24_4_;
  auVar74._28_4_ = auVar60._28_4_ + auVar60._28_4_ + auVar59._28_4_;
  auVar10._4_4_ = fVar40 * fVar40;
  auVar10._0_4_ = fVar38 * fVar38;
  auVar10._8_4_ = fVar41 * fVar41;
  auVar10._12_4_ = fVar43 * fVar43;
  auVar10._16_4_ = fVar44 * fVar44;
  auVar10._20_4_ = fVar45 * fVar45;
  auVar10._24_4_ = fVar46 * fVar46;
  auVar10._28_4_ = fVar42 + auVar73._28_4_;
  auVar6 = vcmpps_avx(auVar74,auVar10,2);
  auVar39 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar81._16_16_ = auVar39;
  auVar81._0_16_ = auVar39;
  auVar59 = vcvtdq2ps_avx(auVar81);
  auVar59 = vcmpps_avx(_DAT_02020f40,auVar59,1);
  auVar60 = auVar59 & auVar6;
  if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar60 >> 0x7f,0) != '\0') ||
        (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar60 >> 0xbf,0) != '\0') ||
      (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar60[0x1f] < '\0') {
    auVar6 = vandps_avx(auVar6,auVar59);
    auVar59 = vsubps_avx(auVar10,auVar74);
    auVar12._4_4_ = fVar52 * auVar59._4_4_;
    auVar12._0_4_ = fVar47 * auVar59._0_4_;
    auVar12._8_4_ = fVar53 * auVar59._8_4_;
    auVar12._12_4_ = fVar54 * auVar59._12_4_;
    auVar12._16_4_ = fVar55 * auVar59._16_4_;
    auVar12._20_4_ = fVar56 * auVar59._20_4_;
    auVar12._24_4_ = fVar57 * auVar59._24_4_;
    auVar12._28_4_ = auVar59._28_4_;
    auVar10 = vsqrtps_avx(auVar12);
    auVar95 = ZEXT3264(auVar10);
    auVar8 = vsubps_avx(auVar8,auVar10);
    auVar85._0_4_ = auVar10._0_4_ + fVar58;
    auVar85._4_4_ = auVar10._4_4_ + fVar66;
    auVar85._8_4_ = auVar10._8_4_ + fVar67;
    auVar85._12_4_ = auVar10._12_4_ + fVar68;
    auVar85._16_4_ = auVar10._16_4_ + fVar69;
    auVar85._20_4_ = auVar10._20_4_ + fVar70;
    auVar85._24_4_ = auVar10._24_4_ + fVar71;
    auVar85._28_4_ = auVar10._28_4_ + fVar72;
    auVar86 = ZEXT3264(auVar85);
    auVar39 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar50._16_16_ = auVar39;
    auVar50._0_16_ = auVar39;
    auVar59 = vcmpps_avx(auVar50,auVar8,2);
    uVar31 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar75._4_4_ = uVar31;
    auVar75._0_4_ = uVar31;
    auVar75._8_4_ = uVar31;
    auVar75._12_4_ = uVar31;
    auVar75._16_4_ = uVar31;
    auVar75._20_4_ = uVar31;
    auVar75._24_4_ = uVar31;
    auVar75._28_4_ = uVar31;
    auVar60 = vcmpps_avx(auVar8,auVar75,2);
    auVar59 = vandps_avx(auVar60,auVar59);
    auVar59 = vandps_avx(auVar59,auVar6);
    auVar98 = ZEXT3264(auVar59);
    auVar60 = vcmpps_avx(auVar50,auVar85,2);
    auVar73 = vcmpps_avx(auVar85,auVar75,2);
    auVar60 = vandps_avx(auVar73,auVar60);
    auVar60 = vandps_avx(auVar60,auVar6);
    auVar99 = ZEXT3264(auVar60);
    auVar60 = vorps_avx(auVar59,auVar60);
    if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar60 >> 0x7f,0) != '\0') ||
          (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar60 >> 0xbf,0) != '\0') ||
        (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar60[0x1f] < '\0')
    {
      auVar64._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      auVar64._8_4_ = -auVar10._8_4_;
      auVar64._12_4_ = -auVar10._12_4_;
      auVar64._16_4_ = -auVar10._16_4_;
      auVar64._20_4_ = -auVar10._20_4_;
      auVar64._24_4_ = -auVar10._24_4_;
      auVar64._28_4_ = -auVar10._28_4_;
      local_1e0 = vblendvps_avx(auVar85,auVar8,auVar59);
      auVar59 = vblendvps_avx(auVar10,auVar64,auVar59);
      fVar58 = auVar59._0_4_;
      fVar94 = auVar59._4_4_;
      auVar13._4_4_ = fVar93 * fVar94;
      auVar13._0_4_ = fVar93 * fVar58;
      fVar37 = auVar59._8_4_;
      auVar13._8_4_ = fVar93 * fVar37;
      fVar38 = auVar59._12_4_;
      auVar13._12_4_ = fVar93 * fVar38;
      fVar45 = auVar59._16_4_;
      auVar13._16_4_ = fVar93 * fVar45;
      fVar40 = auVar59._20_4_;
      auVar13._20_4_ = fVar93 * fVar40;
      fVar46 = auVar59._24_4_;
      auVar13._24_4_ = fVar93 * fVar46;
      auVar13._28_4_ = uVar31;
      auVar14._4_4_ = local_220 * fVar94;
      auVar14._0_4_ = local_220 * fVar58;
      auVar14._8_4_ = local_220 * fVar37;
      auVar14._12_4_ = local_220 * fVar38;
      auVar14._16_4_ = local_220 * fVar45;
      auVar14._20_4_ = local_220 * fVar40;
      auVar14._24_4_ = local_220 * fVar46;
      auVar14._28_4_ = auVar6._28_4_;
      auVar15._4_4_ = fVar96 * fVar94;
      auVar15._0_4_ = fVar96 * fVar58;
      auVar15._8_4_ = fVar96 * fVar37;
      auVar15._12_4_ = fVar96 * fVar38;
      auVar15._16_4_ = fVar96 * fVar45;
      auVar15._20_4_ = fVar96 * fVar40;
      auVar15._24_4_ = fVar96 * fVar46;
      auVar15._28_4_ = auVar59._28_4_;
      local_1c0 = vsubps_avx(auVar13,auVar9);
      auVar76 = ZEXT3264(local_1c0);
      local_1a0 = vsubps_avx(auVar14,auVar7);
      local_180 = vsubps_avx(auVar15,auVar61);
      auVar65 = ZEXT3264(local_180);
      uVar31 = vmovmskps_avx(auVar60);
      uVar25 = CONCAT44((int)((ulong)lVar33 >> 0x20),uVar31);
      lVar24 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar82 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      fVar93 = local_220;
      fVar58 = local_220;
      fVar94 = local_220;
      fVar37 = local_220;
      fVar38 = local_220;
      fVar45 = local_220;
      fVar40 = local_220;
      fVar46 = fVar96;
      fVar41 = fVar96;
      fVar42 = fVar96;
      fVar43 = fVar96;
      fVar44 = fVar96;
      fVar47 = fVar96;
      fVar52 = fVar96;
      local_320 = k;
      do {
        local_310.hit = (RTCHitN *)local_2b0;
        uVar23 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar1 = *(uint *)(local_200 + uVar23 * 4);
        pGVar3 = (pSVar2->geometries).items[uVar1].ptr;
        local_310.ray = (RTCRayN *)ray;
        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar25 = uVar25 ^ 1L << (uVar23 & 0x3f);
          bVar35 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar35 = false;
        }
        else {
          local_314 = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar23 * 4);
          local_310.context = context->user;
          local_250 = vpshufd_avx(ZEXT416(uVar1),0);
          local_260._4_4_ = (sphere->primIDs).field_0.i[uVar23];
          local_2b0._4_4_ = *(undefined4 *)(local_1c0 + uVar23 * 4);
          uVar31 = *(undefined4 *)(local_1a0 + uVar23 * 4);
          local_2a0._4_4_ = uVar31;
          local_2a0._0_4_ = uVar31;
          local_2a0._8_4_ = uVar31;
          local_2a0._12_4_ = uVar31;
          auVar76 = ZEXT1664(local_2a0);
          uVar31 = *(undefined4 *)(local_180 + uVar23 * 4);
          local_290._4_4_ = uVar31;
          local_290._0_4_ = uVar31;
          local_290._8_4_ = uVar31;
          local_290._12_4_ = uVar31;
          local_2b0._0_4_ = local_2b0._4_4_;
          local_2b0._8_4_ = local_2b0._4_4_;
          local_2b0._12_4_ = local_2b0._4_4_;
          auVar65 = ZEXT464(0) << 0x20;
          local_280 = ZEXT432(0) << 0x20;
          local_260._0_4_ = local_260._4_4_;
          local_260._8_4_ = local_260._4_4_;
          local_260._12_4_ = local_260._4_4_;
          vcmpps_avx(local_280,ZEXT432(0) << 0x20,0xf);
          uStack_23c = (local_310.context)->instID[0];
          local_240 = uStack_23c;
          uStack_238 = uStack_23c;
          uStack_234 = uStack_23c;
          uStack_230 = (local_310.context)->instPrimID[0];
          uStack_22c = uStack_230;
          uStack_228 = uStack_230;
          uStack_224 = uStack_230;
          local_330 = *(undefined8 *)(mm_lookupmask_ps + lVar24);
          uStack_328 = *(undefined8 *)(mm_lookupmask_ps + lVar24 + 8);
          local_310.valid = (int *)&local_330;
          local_310.geometryUserPtr = pGVar3->userPtr;
          local_310.N = 4;
          local_2e0 = auVar92._0_32_;
          local_80 = fVar96;
          fStack_7c = fVar46;
          fStack_78 = fVar41;
          fStack_74 = fVar42;
          fStack_70 = fVar43;
          fStack_6c = fVar44;
          fStack_68 = fVar47;
          fStack_64 = fVar52;
          local_a0 = auVar97._0_32_;
          local_c0 = auVar88._0_32_;
          local_e0 = auVar90._0_32_;
          local_100 = auVar86._0_32_;
          local_120 = auVar95._0_32_;
          local_140 = auVar98._0_32_;
          local_160 = auVar99._0_32_;
          fStack_21c = fVar93;
          fStack_218 = fVar58;
          fStack_214 = fVar94;
          fStack_210 = fVar37;
          fStack_20c = fVar38;
          fStack_208 = fVar45;
          fStack_204 = fVar40;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar65 = ZEXT464(0) << 0x20;
            auVar76 = ZEXT1664(local_2a0);
            (*pGVar3->occlusionFilterN)(&local_310);
            auVar99 = ZEXT3264(local_160);
            auVar98 = ZEXT3264(local_140);
            auVar95 = ZEXT3264(local_120);
            auVar86 = ZEXT3264(local_100);
            auVar90 = ZEXT3264(local_e0);
            auVar88 = ZEXT3264(local_c0);
            auVar97 = ZEXT3264(local_a0);
            auVar92 = ZEXT3264(local_2e0);
            auVar82 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
          }
          auVar39._8_8_ = uStack_328;
          auVar39._0_8_ = local_330;
          if (auVar39 == (undefined1  [16])0x0) {
            auVar48 = ZEXT816(0) << 0x40;
            auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,auVar48);
            auVar48 = vpcmpeqd_avx(auVar48,auVar48);
            auVar39 = auVar39 ^ auVar48;
          }
          else {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              auVar65 = ZEXT1664(auVar65._0_16_);
              auVar76 = ZEXT1664(auVar76._0_16_);
              (*p_Var5)(&local_310);
              auVar99 = ZEXT3264(local_160);
              auVar98 = ZEXT3264(local_140);
              auVar95 = ZEXT3264(local_120);
              auVar86 = ZEXT3264(local_100);
              auVar90 = ZEXT3264(local_e0);
              auVar88 = ZEXT3264(local_c0);
              auVar97 = ZEXT3264(local_a0);
              auVar92 = ZEXT3264(local_2e0);
              auVar82 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            }
            auVar48._8_8_ = uStack_328;
            auVar48._0_8_ = local_330;
            auVar48 = vpcmpeqd_avx((undefined1  [16])0x0,auVar48);
            auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar39 = auVar48 ^ auVar39;
            auVar48 = vblendvps_avx(auVar82._0_16_,*(undefined1 (*) [16])(local_310.ray + 0x80),
                                    auVar48);
            *(undefined1 (*) [16])(local_310.ray + 0x80) = auVar48;
          }
          auVar39 = vpslld_avx(auVar39,0x1f);
          bVar18 = (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar19 = (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar17 = (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar36 = -1 < auVar39[0xf];
          bVar35 = ((bVar18 && bVar19) && bVar17) && bVar36;
          fVar93 = fStack_21c;
          fVar58 = fStack_218;
          fVar94 = fStack_214;
          fVar37 = fStack_210;
          fVar38 = fStack_20c;
          fVar45 = fStack_208;
          fVar40 = fStack_204;
          fVar96 = local_80;
          fVar46 = fStack_7c;
          fVar41 = fStack_78;
          fVar42 = fStack_74;
          fVar43 = fStack_70;
          fVar44 = fStack_6c;
          fVar47 = fStack_68;
          fVar52 = fStack_64;
          if (((bVar18 && bVar19) && bVar17) && bVar36) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_314;
            uVar25 = uVar25 ^ 1L << (uVar23 & 0x3f);
          }
        }
      } while ((bVar35 != false) && (uVar25 != 0));
      auVar6 = vandps_avx(auVar98._0_32_,auVar99._0_32_);
      uVar31 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar51._4_4_ = uVar31;
      auVar51._0_4_ = uVar31;
      auVar51._8_4_ = uVar31;
      auVar51._12_4_ = uVar31;
      auVar51._16_4_ = uVar31;
      auVar51._20_4_ = uVar31;
      auVar51._24_4_ = uVar31;
      auVar51._28_4_ = uVar31;
      auVar59 = vcmpps_avx(auVar86._0_32_,auVar51,2);
      auVar60 = auVar6 & auVar59;
      if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar60 >> 0x7f,0) == '\0') &&
            (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar60 >> 0xbf,0) == '\0') &&
          (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar60[0x1f])
      {
        return (bool)(bVar35 ^ 1U);
      }
      auVar6 = vandps_avx(auVar59,auVar6);
      fVar40 = auVar95._0_4_;
      fVar52 = auVar95._4_4_;
      auVar16._4_4_ = auVar92._4_4_ * fVar52;
      auVar16._0_4_ = auVar92._0_4_ * fVar40;
      fVar53 = auVar95._8_4_;
      auVar16._8_4_ = auVar92._8_4_ * fVar53;
      fVar54 = auVar95._12_4_;
      auVar16._12_4_ = auVar92._12_4_ * fVar54;
      fVar55 = auVar95._16_4_;
      auVar16._16_4_ = auVar92._16_4_ * fVar55;
      fVar56 = auVar95._20_4_;
      auVar16._20_4_ = auVar92._20_4_ * fVar56;
      fVar57 = auVar95._24_4_;
      auVar16._24_4_ = auVar92._24_4_ * fVar57;
      auVar16._28_4_ = auVar59._28_4_;
      auVar95._0_4_ = local_220 * fVar40;
      auVar95._4_4_ = fVar93 * fVar52;
      auVar95._8_4_ = fVar58 * fVar53;
      auVar95._12_4_ = fVar94 * fVar54;
      auVar95._16_4_ = fVar37 * fVar55;
      auVar95._20_4_ = fVar38 * fVar56;
      auVar95._28_36_ = auVar65._28_36_;
      auVar95._24_4_ = fVar45 * fVar57;
      auVar98._0_4_ = fVar96 * fVar40;
      auVar98._4_4_ = fVar46 * fVar52;
      auVar98._8_4_ = fVar41 * fVar53;
      auVar98._12_4_ = fVar42 * fVar54;
      auVar98._16_4_ = fVar43 * fVar55;
      auVar98._20_4_ = fVar44 * fVar56;
      auVar98._28_36_ = auVar76._28_36_;
      auVar98._24_4_ = fVar47 * fVar57;
      local_1c0 = vsubps_avx(auVar16,auVar97._0_32_);
      local_1a0 = vsubps_avx(auVar95._0_32_,auVar88._0_32_);
      local_180 = vsubps_avx(auVar98._0_32_,auVar90._0_32_);
      local_1e0 = auVar86._0_32_;
      pSVar2 = context->scene;
      uVar31 = vmovmskps_avx(auVar6);
      uVar25 = CONCAT44((int)((ulong)(mm_lookupmask_ps + lVar24) >> 0x20),uVar31);
      lVar24 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar39 = ZEXT816(0) << 0x40;
      auVar88 = ZEXT1664(auVar39);
      auVar6 = vcmpps_avx(ZEXT1632(auVar39),ZEXT1632(auVar39),0xf);
      auVar90 = ZEXT3264(auVar6);
      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar39 = vpcmpeqd_avx(auVar92._0_16_,auVar92._0_16_);
      auVar92 = ZEXT1664(auVar39);
      do {
        local_310.hit = (RTCHitN *)local_2b0;
        uVar23 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar1 = *(uint *)(local_200 + uVar23 * 4);
        pGVar3 = (pSVar2->geometries).items[uVar1].ptr;
        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar25 = uVar25 ^ 1L << (uVar23 & 0x3f);
          bVar36 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar36 = false;
        }
        else {
          local_220 = *(float *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar23 * 4);
          local_310.context = context->user;
          local_250 = vpshufd_avx(ZEXT416(uVar1),0);
          uVar1 = (sphere->primIDs).field_0.i[uVar23];
          local_260._4_4_ = uVar1;
          local_260._0_4_ = uVar1;
          local_260._8_4_ = uVar1;
          local_260._12_4_ = uVar1;
          uVar31 = *(undefined4 *)(local_1c0 + uVar23 * 4);
          local_2b0._4_4_ = uVar31;
          local_2b0._0_4_ = uVar31;
          local_2b0._8_4_ = uVar31;
          local_2b0._12_4_ = uVar31;
          uVar31 = *(undefined4 *)(local_1a0 + uVar23 * 4);
          local_2a0._4_4_ = uVar31;
          local_2a0._0_4_ = uVar31;
          local_2a0._8_4_ = uVar31;
          local_2a0._12_4_ = uVar31;
          uVar31 = *(undefined4 *)(local_180 + uVar23 * 4);
          local_290._4_4_ = uVar31;
          local_290._0_4_ = uVar31;
          local_290._8_4_ = uVar31;
          local_290._12_4_ = uVar31;
          local_280 = auVar88._0_32_;
          local_2e0 = auVar90._0_32_;
          uStack_23c = (local_310.context)->instID[0];
          local_240 = uStack_23c;
          uStack_238 = uStack_23c;
          uStack_234 = uStack_23c;
          uStack_230 = (local_310.context)->instPrimID[0];
          uStack_22c = uStack_230;
          uStack_228 = uStack_230;
          uStack_224 = uStack_230;
          local_330 = *(undefined8 *)(mm_lookupmask_ps + lVar24);
          uStack_328 = *(undefined8 *)(mm_lookupmask_ps + lVar24 + 8);
          local_310.valid = (int *)&local_330;
          local_310.geometryUserPtr = pGVar3->userPtr;
          local_310.N = 4;
          local_310.ray = (RTCRayN *)ray;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar39 = auVar92._0_16_;
            (*pGVar3->occlusionFilterN)(&local_310);
            auVar39 = vpcmpeqd_avx(auVar39,auVar39);
            auVar92 = ZEXT1664(auVar39);
            auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar90 = ZEXT3264(local_2e0);
            auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar82 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            k = local_320;
          }
          auVar21._8_8_ = uStack_328;
          auVar21._0_8_ = local_330;
          auVar39 = auVar92._0_16_;
          if (auVar21 == (undefined1  [16])0x0) {
            auVar48 = vpcmpeqd_avx(auVar97._0_16_,(undefined1  [16])0x0);
            auVar39 = auVar39 ^ auVar48;
          }
          else {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&local_310);
              auVar39 = vpcmpeqd_avx(auVar39,auVar39);
              auVar92 = ZEXT1664(auVar39);
              auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar90 = ZEXT3264(local_2e0);
              auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar82 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              k = local_320;
            }
            auVar22._8_8_ = uStack_328;
            auVar22._0_8_ = local_330;
            auVar48 = vpcmpeqd_avx(auVar97._0_16_,auVar22);
            auVar39 = auVar92._0_16_ ^ auVar48;
            auVar48 = vblendvps_avx(auVar82._0_16_,*(undefined1 (*) [16])(local_310.ray + 0x80),
                                    auVar48);
            *(undefined1 (*) [16])(local_310.ray + 0x80) = auVar48;
          }
          auVar39 = vpslld_avx(auVar39,0x1f);
          bVar19 = (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar20 = (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar18 = (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar17 = -1 < auVar39[0xf];
          bVar36 = ((bVar19 && bVar20) && bVar18) && bVar17;
          if (((bVar19 && bVar20) && bVar18) && bVar17) {
            *(float *)(ray + k * 4 + 0x80) = local_220;
            uVar25 = uVar25 ^ 1L << (uVar23 & 0x3f);
          }
        }
      } while ((bVar36 != false) && (uVar25 != 0));
      return (bool)(bVar35 ^ 1U | bVar36 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }